

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O0

int __thiscall
Rainbow::CommPort::CheckRespondCode
          (CommPort *this,string *respondMessage,string *futureCode,string *errorDesc)

{
  __type _Var1;
  bool bVar2;
  const_iterator __str;
  pointer ppVar3;
  string *in_RCX;
  ulong in_RSI;
  string *in_RDI;
  const_iterator search;
  string respondCode;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  _Self local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  _Self local_58;
  undefined4 local_4c;
  string local_48 [32];
  string *local_28;
  int local_4;
  
  local_28 = in_RCX;
  std::__cxx11::string::substr((ulong)local_48,in_RSI);
  _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (_Var1) {
    local_4 = 0;
  }
  else {
    __str = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (key_type *)0x12f82b);
    local_58._M_node = __str._M_node;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    bVar2 = std::operator!=(&local_58,&local_70);
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x12f86f);
      std::__cxx11::string::operator=(in_RDI,(string *)&ppVar3->second);
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x12f88c);
      std::__cxx11::string::operator=(local_28,(string *)&ppVar3->second);
      local_4 = std::__cxx11::stoi((string *)__str._M_node,
                                   (size_t *)
                                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
      if (local_4 < 1) {
        local_4 = -local_4;
      }
      local_4 = -local_4;
    }
    else {
      std::__cxx11::string::operator=(local_28,"Unknow error");
      local_4 = -1;
    }
  }
  local_4c = 1;
  std::__cxx11::string::~string(local_48);
  return local_4;
}

Assistant:

int CommPort::CheckRespondCode(const std::string &respondMessage, 
					const std::string &futureCode,
					std::string &errorDesc)
	{
		std::string respondCode = respondMessage.substr(0, 3);
		
		if(respondCode == futureCode)
		{
			//errorDesc = "";
			return 0;
		}

		auto search = _errDescTable.find(respondCode);
		if(search != _errDescTable.end())
		{
			_errorMessage = search->second;
			errorDesc = search->second;
			return -(std::abs(std::stoi(respondCode)));
		}

		errorDesc = "Unknow error";
		return -1;
	}